

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O2

AtomType * __thiscall OpenMD::ForceField::getAtomType(ForceField *this,int ident)

{
  iterator iVar1;
  AtomType *pAVar2;
  string at;
  int local_34;
  string local_30;
  
  local_34 = ident;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->atypeIdentToName)._M_t,&local_34);
  std::__cxx11::string::string((string *)&local_30,(string *)&iVar1._M_node[1]._M_parent);
  pAVar2 = getAtomType(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pAVar2;
}

Assistant:

AtomType* ForceField::getAtomType(int ident) {
    std::string at = atypeIdentToName.find(ident)->second;
    return getAtomType(at);
  }